

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenSwitchSetDefaultName(BinaryenExpressionRef expr,char *name)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *name_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)name;
  name_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::Switch>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x8aa,"void BinaryenSwitchSetDefaultName(BinaryenExpressionRef, const char *)");
  }
  wasm::Name::Name(&local_30,(char *)expression);
  wasm::Name::operator=((Name *)(local_20 + 3),&local_30);
  return;
}

Assistant:

void BinaryenSwitchSetDefaultName(BinaryenExpressionRef expr,
                                  const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  // may be null or empty
  static_cast<Switch*>(expression)->default_ = name;
}